

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  bool bVar2;
  cmConditionEvaluator *this_00;
  _Self __tmp;
  _List_node_base *p_Var3;
  _Self __tmp_1;
  int reducible;
  iterator arg;
  allocator local_7d;
  int local_7c;
  iterator local_78;
  iterator local_70;
  string *local_68;
  MessageType *local_60;
  iterator local_58;
  string local_50;
  
  local_68 = errorString;
  local_60 = status;
  do {
    local_7c = 0;
    p_Var3 = (newArgs->
             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)newArgs) {
      p_Var1 = p_Var3->_M_next;
      local_78._M_node = p_Var3;
      if (p_Var1 != (_List_node_base *)newArgs) {
        local_70._M_node = p_Var1->_M_next;
        local_58._M_node = p_Var1;
        std::__cxx11::string::string((string *)&local_50,"NOT",&local_7d);
        bVar2 = IsKeyword(this,&local_50,(cmExpandedCommandArgument *)(p_Var3 + 1));
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          this_00 = this;
          bVar2 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(p_Var1 + 1),local_68,local_60,false)
          ;
          HandlePredicate(this_00,!bVar2,&local_7c,&local_78,newArgs,&local_58,&local_70);
        }
      }
      p_Var3 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&(local_78._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    }
  } while (local_7c != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("NOT", *arg))
        {
        bool rhs = this->GetBooleanValueWithAutoDereference(*argP1,
                                                      errorString,
                                                      status);
        this->HandlePredicate(!rhs, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}